

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O3

void HPDF_MemStream_FreeFunc(HPDF_Stream stream)

{
  undefined8 *aptr;
  
  aptr = (undefined8 *)stream->attr;
  HPDF_MemStream_FreeData(stream);
  HPDF_List_Free((HPDF_List)*aptr);
  HPDF_FreeMem(stream->mmgr,aptr);
  stream->attr = (void *)0x0;
  return;
}

Assistant:

void
HPDF_MemStream_FreeFunc  (HPDF_Stream  stream)
{
    HPDF_MemStreamAttr attr;

    HPDF_PTRACE((" HPDF_MemStream_FreeFunc\n"));

    attr = (HPDF_MemStreamAttr)stream->attr;
    HPDF_MemStream_FreeData (stream);
    HPDF_List_Free (attr->buf);
    HPDF_FreeMem (stream->mmgr, attr);
    stream->attr = NULL;
}